

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageColorContrast(Image *image,float contrast)

{
  ushort uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  Color *pCVar4;
  long lVar5;
  uint uVar6;
  uchar uVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar18 [16];
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    fVar10 = -100.0;
    if (-100.0 <= contrast) {
      fVar10 = contrast;
    }
    fVar11 = 100.0;
    if (fVar10 <= 100.0) {
      fVar11 = fVar10;
    }
    fVar10 = (fVar11 + 100.0) / 100.0;
    fVar10 = fVar10 * fVar10;
    pCVar4 = LoadImageColors(*image);
    auVar3 = _DAT_00174210;
    fVar11 = (float)DAT_00174210;
    fVar12 = DAT_00174210._4_4_;
    fVar13 = DAT_00174210._8_4_;
    fVar14 = DAT_00174210._12_4_;
    for (lVar5 = 0; lVar5 < (long)image->height * (long)image->width; lVar5 = lVar5 + 1) {
      uVar1._0_1_ = pCVar4[lVar5].r;
      uVar1._1_1_ = pCVar4[lVar5].g;
      auVar16._0_4_ = (float)(uVar1 & 0xff);
      auVar16._4_4_ = (float)(byte)uVar1._1_1_;
      auVar16._8_8_ = 0;
      auVar16 = divps(auVar16,auVar3);
      auVar17._0_4_ = ((auVar16._0_4_ + -0.5) * fVar10 + 0.5) * fVar11;
      auVar17._4_4_ = ((auVar16._4_4_ + -0.5) * fVar10 + 0.5) * fVar12;
      auVar17._8_4_ = ((auVar16._8_4_ + 0.0) * fVar10 + 0.0) * fVar13;
      auVar17._12_4_ = ((auVar16._12_4_ + 0.0) * fVar10 + 0.0) * fVar14;
      auVar16 = maxps(ZEXT816(0),auVar17);
      iVar8 = -(uint)(fVar11 < auVar16._0_4_);
      iVar9 = -(uint)(fVar12 < auVar16._4_4_);
      auVar19._4_4_ = iVar9;
      auVar19._0_4_ = iVar8;
      auVar19._8_4_ = iVar9;
      auVar19._12_4_ = iVar9;
      auVar18._8_8_ = auVar19._8_8_;
      auVar18._4_4_ = iVar8;
      auVar18._0_4_ = iVar8;
      uVar6 = movmskpd((uint)uVar1,auVar18);
      fVar15 = (((float)pCVar4[lVar5].b / 255.0 + -0.5) * fVar10 + 0.5) * 255.0;
      fVar2 = 0.0;
      if (0.0 <= fVar15) {
        fVar2 = fVar15;
      }
      fVar15 = 255.0;
      if (fVar2 <= 255.0) {
        fVar15 = fVar2;
      }
      uVar7 = (uchar)(int)auVar16._0_4_;
      if ((uVar6 & 1) != 0) {
        uVar7 = 0xff;
      }
      pCVar4[lVar5].r = uVar7;
      uVar7 = (uchar)(int)auVar16._4_4_;
      if ((uVar6 & 2) != 0) {
        uVar7 = 0xff;
      }
      pCVar4[lVar5].g = uVar7;
      pCVar4[lVar5].b = (uchar)(int)fVar15;
    }
    iVar8 = image->format;
    free(image->data);
    image->data = pCVar4;
    image->format = 7;
    ImageFormat(image,iVar8);
    return;
  }
  return;
}

Assistant:

void ImageColorContrast(Image *image, float contrast)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (contrast < -100) contrast = -100;
    if (contrast > 100) contrast = 100;

    contrast = (100.0f + contrast)/100.0f;
    contrast *= contrast;

    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        float pR = (float)pixels[i].r/255.0f;
        pR -= 0.5f;
        pR *= contrast;
        pR += 0.5f;
        pR *= 255;
        if (pR < 0) pR = 0;
        if (pR > 255) pR = 255;

        float pG = (float)pixels[i].g/255.0f;
        pG -= 0.5f;
        pG *= contrast;
        pG += 0.5f;
        pG *= 255;
        if (pG < 0) pG = 0;
        if (pG > 255) pG = 255;

        float pB = (float)pixels[i].b/255.0f;
        pB -= 0.5f;
        pB *= contrast;
        pB += 0.5f;
        pB *= 255;
        if (pB < 0) pB = 0;
        if (pB > 255) pB = 255;

        pixels[i].r = (unsigned char)pR;
        pixels[i].g = (unsigned char)pG;
        pixels[i].b = (unsigned char)pB;
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}